

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall
cmCTest::RunMakeCommand
          (cmCTest *this,char *command,string *output,int *retVal,char *dir,int timeout,ostream *ofs
          ,Encoding encoding)

{
  int iVar1;
  int iVar2;
  size_t cc;
  ostream *poVar3;
  cmsysProcess *cp;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  pointer ppcVar7;
  ulong uVar8;
  const_iterator a;
  pointer pbVar9;
  cmProcessOutput processOutput;
  cmCTestLogWrite local_260 [2];
  string strdata;
  int length;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  char *data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ostringstream cmCTestLog_msg;
  string local_50;
  
  cmSystemTools::ParseArguments_abi_cxx11_(&args,(cmSystemTools *)command,(char *)output);
  if (args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar1 = 0;
    goto LAB_002de7f3;
  }
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (pbVar9 = args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar9 != args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
    _cmCTestLog_msg = (pbVar9->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&cmCTestLog_msg);
  }
  _cmCTestLog_msg = (pointer)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&cmCTestLog_msg);
  std::__cxx11::string::assign((char *)output);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  std::operator<<((ostream *)&cmCTestLog_msg,"Run command:");
  std::__cxx11::stringbuf::str();
  Log(this,4,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x3d7,strdata._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&strdata);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  for (ppcVar7 = argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      (ppcVar7 !=
       argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish && (*ppcVar7 != (char *)0x0)); ppcVar7 = ppcVar7 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg," \"");
    poVar3 = std::operator<<(poVar3,*ppcVar7);
    std::operator<<(poVar3,"\"");
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x3da,strdata._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&strdata);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  std::endl<char,std::char_traits<char>>((ostream *)&cmCTestLog_msg);
  std::__cxx11::stringbuf::str();
  Log(this,4,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x3dc,strdata._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&strdata);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand
            (cp,argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start);
  cmsysProcess_SetWorkingDirectory(cp,dir);
  cmsysProcess_SetOption(cp,0,1);
  cmsysProcess_SetTimeout(cp,(double)timeout);
  cmsysProcess_Execute(cp);
  cmProcessOutput::cmProcessOutput(&processOutput,encoding,0x400);
  strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
  strdata._M_string_length = 0;
  strdata.field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"   Each . represents ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," bytes of output");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<(poVar3,"    ");
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,3,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x3f1,local_260[0].Data,false);
  std::__cxx11::string::~string((string *)local_260);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  uVar8 = 0;
  while( true ) {
    iVar1 = cmsysProcess_WaitForData(cp,&data,&length,(double *)0x0);
    if (iVar1 == 0) break;
    cmProcessOutput::DecodeText(&processOutput,data,(long)length,&strdata,0);
    for (uVar4 = 0; uVar4 < strdata._M_string_length; uVar4 = uVar4 + 1) {
      if (strdata._M_dataplus._M_p[uVar4] == '\0') {
        strdata._M_dataplus._M_p[uVar4] = '\n';
      }
    }
    std::__cxx11::string::append((string *)output);
    lVar5 = -uVar8;
    uVar4 = uVar8 << 10;
    while( true ) {
      uVar8 = uVar8 + 1;
      if (output->_M_string_length <= uVar4) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      std::operator<<((ostream *)&cmCTestLog_msg,".");
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,3,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x3fc,local_260[0].Data,false);
      std::__cxx11::string::~string((string *)local_260);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      if ((lVar5 != 1) && ((uVar8 / 0x32) * -0x32 + 1 == lVar5)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"  Size: ");
        poVar3 = (ostream *)
                 std::ostream::operator<<
                           (poVar3,(int)((((double)CONCAT44(0x45300000,
                                                            (int)(output->_M_string_length >> 0x20))
                                          - 1.9342813113834067e+25) +
                                         ((double)CONCAT44(0x43300000,(int)output->_M_string_length)
                                         - 4503599627370496.0)) * 0.0009765625 + 1.0));
        poVar3 = std::operator<<(poVar3,"K");
        poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
        std::operator<<(poVar3,"    ");
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,3,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x401,local_260[0].Data,false);
        std::__cxx11::string::~string((string *)local_260);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
      lVar5 = lVar5 + -1;
      uVar4 = uVar4 + 0x400;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    local_260[0].Data = strdata._M_dataplus._M_p;
    local_260[0].Length = strdata._M_string_length;
    operator<<((ostream *)&cmCTestLog_msg,local_260);
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x405,local_260[0].Data,false);
    uVar8 = -lVar5;
    std::__cxx11::string::~string((string *)local_260);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    if (((&ofs->field_0x20)[(long)ofs->_vptr_basic_ostream[-3]] & 5) == 0) {
      _cmCTestLog_msg = strdata._M_dataplus._M_p;
      operator<<(ofs,(cmCTestLogWrite *)&cmCTestLog_msg);
    }
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  cmProcessOutput::DecodeText(&processOutput,&local_50,&strdata,0);
  std::__cxx11::string::~string((string *)&local_50);
  if (strdata._M_string_length != 0) {
    std::__cxx11::string::append((string *)output);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    local_260[0].Data = strdata._M_dataplus._M_p;
    local_260[0].Length = strdata._M_string_length;
    operator<<((ostream *)&cmCTestLog_msg,local_260);
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x40e,local_260[0].Data,false);
    std::__cxx11::string::~string((string *)local_260);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    if (((&ofs->field_0x20)[(long)ofs->_vptr_basic_ostream[-3]] & 5) == 0) {
      _cmCTestLog_msg = strdata._M_dataplus._M_p;
      operator<<(ofs,(cmCTestLogWrite *)&cmCTestLog_msg);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar3 = std::operator<<((ostream *)&cmCTestLog_msg," Size of output: ");
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(int)((((double)CONCAT44(0x45300000,
                                                      (int)(output->_M_string_length >> 0x20)) -
                                    1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)output->_M_string_length) -
                                   4503599627370496.0)) * 0.0009765625));
  poVar3 = std::operator<<(poVar3,"K");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::stringbuf::str();
  Log(this,3,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x414,local_260[0].Data,false);
  std::__cxx11::string::~string((string *)local_260);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  iVar1 = cmsysProcess_GetState(cp);
  switch(iVar1) {
  case 1:
    std::__cxx11::string::append((char *)output);
    cmsysProcess_GetErrorString(cp);
    std::__cxx11::string::append((char *)output);
    std::__cxx11::string::append((char *)output);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"There was an error: ");
    pcVar6 = cmsysProcess_GetErrorString(cp);
    poVar3 = std::operator<<(poVar3,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,6,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x429,local_260[0].Data,false);
    break;
  case 2:
    iVar2 = cmsysProcess_GetExitException(cp);
    *retVal = iVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"There was an exception: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*retVal);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x421,local_260[0].Data,false);
    break;
  default:
    goto switchD_002de5bb_caseD_3;
  case 4:
    iVar2 = cmsysProcess_GetExitValue(cp);
    *retVal = iVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Command exited with the value: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*retVal);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x41d,local_260[0].Data,false);
    break;
  case 5:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"There was a timeout");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x423,local_260[0].Data,false);
  }
  std::__cxx11::string::~string((string *)local_260);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
switchD_002de5bb_caseD_3:
  cmsysProcess_Delete(cp);
  std::__cxx11::string::~string((string *)&strdata);
  cmProcessOutput::~cmProcessOutput(&processOutput);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
LAB_002de7f3:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  return iVar1;
}

Assistant:

int cmCTest::RunMakeCommand(const char* command, std::string& output,
                            int* retVal, const char* dir, int timeout,
                            std::ostream& ofs, Encoding encoding)
{
  // First generate the command and arguments
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);

  if (args.empty()) {
    return false;
  }

  std::vector<const char*> argv;
  for (std::vector<std::string>::const_iterator a = args.begin();
       a != args.end(); ++a) {
    argv.push_back(a->c_str());
  }
  argv.push_back(CM_NULLPTR);

  output = "";
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Run command:");
  std::vector<const char*>::iterator ait;
  for (ait = argv.begin(); ait != argv.end() && *ait; ++ait) {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, " \"" << *ait << "\"");
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, std::endl);

  // Now create process object
  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  // Initialize tick's
  std::string::size_type tick = 0;
  std::string::size_type tick_len = 1024;
  std::string::size_type tick_line_len = 50;

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT, "   Each . represents "
               << tick_len << " bytes of output" << std::endl
               << "    " << std::flush);
  while (cmsysProcess_WaitForData(cp, &data, &length, CM_NULLPTR)) {
    processOutput.DecodeText(data, length, strdata);
    for (size_t cc = 0; cc < strdata.size(); ++cc) {
      if (strdata[cc] == 0) {
        strdata[cc] = '\n';
      }
    }
    output.append(strdata);
    while (output.size() > (tick * tick_len)) {
      tick++;
      cmCTestLog(this, HANDLER_PROGRESS_OUTPUT, "." << std::flush);
      if (tick % tick_line_len == 0 && tick > 0) {
        cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
                   "  Size: " << int((double(output.size()) / 1024.0) + 1)
                              << "K" << std::endl
                              << "    " << std::flush);
      }
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (ofs) {
      ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
    }
  }
  processOutput.DecodeText(std::string(), strdata);
  if (!strdata.empty()) {
    output.append(strdata);
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (ofs) {
      ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
    }
  }
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT, " Size of output: "
               << int(double(output.size()) / 1024.0) << "K" << std::endl);

  cmsysProcess_WaitForExit(cp, CM_NULLPTR);

  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    *retVal = cmsysProcess_GetExitValue(cp);
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               "Command exited with the value: " << *retVal << std::endl);
  } else if (result == cmsysProcess_State_Exception) {
    *retVal = cmsysProcess_GetExitException(cp);
    cmCTestLog(this, WARNING, "There was an exception: " << *retVal
                                                         << std::endl);
  } else if (result == cmsysProcess_State_Expired) {
    cmCTestLog(this, WARNING, "There was a timeout" << std::endl);
  } else if (result == cmsysProcess_State_Error) {
    output += "\n*** ERROR executing: ";
    output += cmsysProcess_GetErrorString(cp);
    output += "\n***The build process failed.";
    cmCTestLog(this, ERROR_MESSAGE, "There was an error: "
                 << cmsysProcess_GetErrorString(cp) << std::endl);
  }

  cmsysProcess_Delete(cp);

  return result;
}